

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O3

LY_ERR lys_compile_node_list(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  byte *pbVar1;
  int iVar2;
  lys_module *plVar3;
  lysp_node **pplVar4;
  LY_ERR LVar5;
  long *plVar6;
  lysp_ext_instance *plVar7;
  ushort **ppuVar8;
  lysc_node *plVar9;
  lysc_node *plVar10;
  long lVar11;
  char *pcVar12;
  lysc_node *plVar13;
  lysc_node *plVar14;
  LY_VECODE code;
  lysc_node **pplVar15;
  lysp_restr *must_p;
  ly_ctx *plVar16;
  lysp_ext_instance *plVar17;
  size_t name_len;
  lysp_node *plVar18;
  long lVar19;
  long lVar20;
  lysp_node *plVar21;
  
  iVar2._0_2_ = pnode[2].nodetype;
  iVar2._2_2_ = pnode[2].flags;
  *(int *)&node[1].dsc = iVar2;
  if (iVar2 != 0) {
    *(byte *)&node->flags = (byte)node->flags | 0x20;
  }
  *(uint *)((long)&node[1].dsc + 4) =
       -(uint)(*(uint *)&pnode[2].field_0xc == 0) | *(uint *)&pnode[2].field_0xc;
  for (plVar18 = (lysp_node *)pnode[1].ref; plVar18 != (lysp_node *)0x0; plVar18 = plVar18->next) {
    LVar5 = lys_compile_node(ctx,plVar18,node,0,(ly_set *)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  plVar18 = pnode[1].parent;
  if (plVar18 != (lysp_node *)0x0) {
    plVar3 = node[1].module;
    if (plVar3 == (lys_module *)0x0) {
      plVar6 = (long *)calloc(1,(long)plVar18[-1].exts * 0x38 + 8);
      if (plVar6 == (long *)0x0) goto LAB_0014a3e7;
      lVar11 = 0;
      lVar19 = 0;
    }
    else {
      lVar19 = *(long *)&plVar3[-1].implemented;
      plVar6 = (long *)realloc(&plVar3[-1].implemented,
                               ((long)&(plVar18[-1].exts)->name + lVar19 * 2) * 0x38 + 8);
      if (plVar6 == (long *)0x0) {
LAB_0014a3e7:
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_list")
        ;
        return LY_EMEM;
      }
      lVar11 = *plVar6;
    }
    node[1].module = (lys_module *)(plVar6 + 1);
    if (pnode[1].parent == (lysp_node *)0x0) {
      plVar17 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar17 = pnode[1].parent[-1].exts;
    }
    lVar20 = 0;
    memset(plVar6 + lVar11 * 7 + 1,0,((long)&plVar17->name + lVar19) * 0x38);
    plVar17 = (lysp_ext_instance *)0xffffffffffffffff;
    while( true ) {
      plVar18 = pnode[1].parent;
      if (plVar18 == (lysp_node *)0x0) {
        plVar7 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar7 = plVar18[-1].exts;
      }
      plVar17 = (lysp_ext_instance *)((long)&plVar17->name + 1);
      if (plVar7 <= plVar17) break;
      plVar3 = node[1].module;
      lVar19 = *(long *)&plVar3[-1].implemented;
      *(long *)&plVar3[-1].implemented = lVar19 + 1;
      must_p = (lysp_restr *)((long)&plVar18->parent + lVar20);
      lVar20 = lVar20 + 0x40;
      LVar5 = lys_compile_must(ctx,must_p,(lysc_must *)(&plVar3->ctx + lVar19 * 7));
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
    }
  }
  LVar5 = lysc_unres_must_add(ctx,node,pnode);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if ((node->flags & 1) != 0) {
    plVar13 = node;
    if ((ctx->compile_opts & 1) == 0) {
LAB_0014a4a6:
      if ((pnode[1].next == (lysp_node *)0x0) || (*(char *)&(pnode[1].next)->parent == '\0')) {
        plVar16 = ctx->ctx;
        pcVar12 = "Missing key in list representing configuration data.";
LAB_0014a7bf:
        ly_vlog(plVar16,(char *)0x0,LYVE_SEMANTICS,pcVar12);
        return LY_EVALID;
      }
    }
    else {
      do {
        if ((plVar13->flags & 0x800) != 0) goto LAB_0014a4a6;
        pplVar15 = &plVar13->parent;
        plVar13 = *pplVar15;
      } while (*pplVar15 != (lysc_node *)0x0);
    }
  }
  if (pnode[1].next == (lysp_node *)0x0) {
    node->flags = node->flags & 0xfd3f | 0x240;
  }
  else {
    plVar13 = (lysc_node *)0x0;
    plVar18 = pnode[1].next;
    do {
      pcVar12 = strpbrk((char *)plVar18," \t\n");
      if (pcVar12 == (char *)0x0) {
        name_len = strlen((char *)plVar18);
        plVar21 = (lysp_node *)0x0;
      }
      else {
        ppuVar8 = __ctype_b_loc();
        plVar21 = (lysp_node *)(pcVar12 + -1);
        do {
          pplVar4 = &plVar21->parent;
          plVar21 = (lysp_node *)((long)&plVar21->parent + 1);
        } while ((*(byte *)((long)*ppuVar8 + (long)*(char *)((long)pplVar4 + 1) * 2 + 1) & 0x20) !=
                 0);
        name_len = (long)pcVar12 - (long)plVar18;
      }
      plVar9 = lys_find_child(node,node->module,(char *)plVar18,name_len,4,2);
      if (plVar9 == (lysc_node *)0x0) {
        plVar16 = ctx->ctx;
        pcVar12 = "The list\'s key \"%.*s\" not found.";
        code = LYVE_REFERENCE;
LAB_0014a764:
        ly_vlog(plVar16,(char *)0x0,code,pcVar12,name_len & 0xffffffff,plVar18);
        return LY_EVALID;
      }
      if ((plVar9->flags & 0x100) != 0) {
        plVar16 = ctx->ctx;
        pcVar12 = "Duplicated key identifier \"%.*s\".";
        code = LYVE_SEMANTICS;
        goto LAB_0014a764;
      }
      lysc_update_path(ctx,node->module,plVar9->name);
      if (((plVar9->flags ^ node->flags) & 3) != 0) {
        plVar16 = ctx->ctx;
        pcVar12 = "Key of a configuration list must not be a state leaf.";
        goto LAB_0014a7bf;
      }
      if (ctx->pmod->version < 2) {
        if (*(int *)&(plVar9[1].parent)->next == 10) {
          plVar16 = ctx->ctx;
          pcVar12 = "List key of the \"empty\" type is allowed only in YANG 1.1 modules.";
          goto LAB_0014a7bf;
        }
      }
      else if (plVar9[1].module != (lys_module *)0x0) {
        plVar16 = ctx->ctx;
        pcVar12 = "List\'s key must not have any \"when\" statement.";
        goto LAB_0014a7bf;
      }
      LVar5 = lysc_check_status(ctx,node->flags,node->module,node->name,plVar9->flags,plVar9->module
                                ,plVar9->name);
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      if (plVar9[1].prev != (lysc_node *)0x0) {
        (**(code **)((plVar9[1].prev)->module->revision + 0x38))(ctx->ctx);
        lysc_type_free(&ctx->free_ctx,(lysc_type *)(plVar9[1].prev)->module);
        free(plVar9[1].prev);
        plVar9[1].prev = (lysc_node *)0x0;
      }
      pbVar1 = (byte *)((long)&plVar9->flags + 1);
      *pbVar1 = *pbVar1 | 1;
      plVar10 = plVar9->prev;
      if (plVar13 == (lysc_node *)0x0) {
        if (plVar10->next != (lysc_node *)0x0) goto LAB_0014a646;
      }
      else if (plVar13 != plVar10) {
LAB_0014a646:
        plVar14 = plVar9->next;
        if (plVar14 == (lysc_node *)0x0) {
          plVar14 = *(lysc_node **)(node + 1);
        }
        plVar14->prev = plVar10;
        if (plVar9->prev->next != (lysc_node *)0x0) {
          plVar9->prev->next = plVar9->next;
        }
        if (plVar13 == (lysc_node *)0x0) {
          plVar9->prev = *(lysc_node **)(*(long *)(node + 1) + 0x20);
          plVar13 = *(lysc_node **)(node + 1);
          plVar9->next = plVar13;
          pplVar15 = &plVar13->prev;
        }
        else {
          plVar9->prev = plVar13;
          plVar10 = plVar13->next;
          plVar9->next = plVar10;
          if (plVar10 == (lysc_node *)0x0) {
            plVar10 = *(lysc_node **)(node + 1);
          }
          pplVar15 = &plVar13->next;
          plVar10->prev = plVar9;
        }
        *pplVar15 = plVar9;
        if (plVar9->prev->next == (lysc_node *)0x0) {
          *(lysc_node **)(node + 1) = plVar9;
        }
      }
      lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
      plVar13 = plVar9;
      plVar18 = plVar21;
    } while (plVar21 != (lysp_node *)0x0);
  }
  LVar5 = lys_compile_node_augments(ctx,node);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if ((pnode[2].parent != (lysp_node *)0x0) &&
     (LVar5 = lys_compile_node_list_unique(ctx,(lysp_qname *)pnode[2].parent,(lysc_node_list *)node)
     , LVar5 != LY_SUCCESS)) {
    return LVar5;
  }
  for (plVar18 = (lysp_node *)pnode[1].iffeatures; plVar18 != (lysp_node *)0x0;
      plVar18 = plVar18->next) {
    LVar5 = lys_compile_node(ctx,plVar18,node,0,(ly_set *)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  for (plVar17 = pnode[1].exts; plVar17 != (lysp_ext_instance *)0x0;
      plVar17 = *(lysp_ext_instance **)&plVar17->format) {
    LVar5 = lys_compile_node(ctx,(lysp_node *)plVar17,node,0,(ly_set *)0x0);
    if (LVar5 != LY_SUCCESS) {
      return LVar5;
    }
  }
  if (*(uint *)((long)&node[1].dsc + 4) < *(uint *)&node[1].dsc) {
    ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
            "List min-elements %u is bigger than max-elements %u.");
    return LY_EVALID;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
lys_compile_node_list(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_list *list_p = (struct lysp_node_list *)pnode;
    struct lysc_node_list *list = (struct lysc_node_list *)node;
    struct lysp_node *child_p;
    struct lysc_node *parent;
    struct lysc_node_leaf *key, *prev_key = NULL;
    size_t len;
    const char *keystr, *delim;
    LY_ERR ret = LY_SUCCESS;

    list->min = list_p->min;
    if (list->min) {
        list->flags |= LYS_MAND_TRUE;
    }
    list->max = list_p->max ? list_p->max : UINT32_MAX;

    LY_LIST_FOR(list_p->child, child_p) {
        LY_CHECK_RET(lys_compile_node(ctx, child_p, node, 0, NULL));
    }

    COMPILE_ARRAY_GOTO(ctx, list_p->musts, list->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* keys */
    if (list->flags & LYS_CONFIG_W) {
        parent = node;
        if (ctx->compile_opts & LYS_COMPILE_GROUPING) {
            /* compiling individual grouping, we can check this only if there is an explicit config set */
            while (parent) {
                if (parent->flags & LYS_SET_CONFIG) {
                    break;
                }
                parent = parent->parent;
            }
        }

        if (parent && (!list_p->key || !list_p->key[0])) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Missing key in list representing configuration data.");
            return LY_EVALID;
        }
    }

    /* find all the keys (must be direct children) */
    keystr = list_p->key;
    if (!keystr) {
        /* keyless list */
        list->flags &= ~LYS_ORDBY_SYSTEM;
        list->flags |= LYS_KEYLESS | LYS_ORDBY_USER;
    }
    while (keystr) {
        delim = strpbrk(keystr, " \t\n");
        if (delim) {
            len = delim - keystr;
            while (isspace(*delim)) {
                ++delim;
            }
        } else {
            len = strlen(keystr);
        }

        /* key node must be present */
        key = (struct lysc_node_leaf *)lys_find_child(node, node->module, keystr, len, LYS_LEAF, LYS_GETNEXT_NOCHOICE);
        if (!key) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "The list's key \"%.*s\" not found.", (int)len, keystr);
            return LY_EVALID;
        }
        /* keys must be unique */
        if (key->flags & LYS_KEY) {
            /* the node was already marked as a key */
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Duplicated key identifier \"%.*s\".", (int)len, keystr);
            return LY_EVALID;
        }

        lysc_update_path(ctx, list->module, key->name);
        /* key must have the same config flag as the list itself */
        if ((list->flags & LYS_CONFIG_MASK) != (key->flags & LYS_CONFIG_MASK)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Key of a configuration list must not be a state leaf.");
            return LY_EVALID;
        }
        if (ctx->pmod->version < LYS_VERSION_1_1) {
            /* YANG 1.0 denies key to be of empty type */
            if (key->type->basetype == LY_TYPE_EMPTY) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "List key of the \"empty\" type is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else {
            /* when and if-feature are illegal on list keys */
            if (key->when) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List's key must not have any \"when\" statement.");
                return LY_EVALID;
            }
            /* unable to check if-features but compilation would fail if disabled */
        }

        /* check status */
        LY_CHECK_RET(lysc_check_status(ctx, list->flags, list->module, list->name, key->flags, key->module, key->name));

        /* ignore default values of the key */
        if (key->dflt) {
            key->dflt->realtype->plugin->free(ctx->ctx, key->dflt);
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)key->dflt->realtype);
            free(key->dflt);
            key->dflt = NULL;
        }
        /* mark leaf as key */
        key->flags |= LYS_KEY;

        /* move it to the correct position */
        if ((prev_key && ((struct lysc_node *)prev_key != key->prev)) || (!prev_key && key->prev->next)) {
            /* fix links in closest previous siblings of the key */
            if (key->next) {
                key->next->prev = key->prev;
            } else {
                /* last child */
                list->child->prev = key->prev;
            }
            if (key->prev->next) {
                key->prev->next = key->next;
            }
            /* fix links in the key */
            if (prev_key) {
                key->prev = &prev_key->node;
                key->next = prev_key->next;
            } else {
                key->prev = list->child->prev;
                key->next = list->child;
            }
            /* fix links in closes future siblings of the key */
            if (prev_key) {
                if (prev_key->next) {
                    prev_key->next->prev = &key->node;
                } else {
                    list->child->prev = &key->node;
                }
                prev_key->next = &key->node;
            } else {
                list->child->prev = &key->node;
            }
            /* fix links in parent */
            if (!key->prev->next) {
                list->child = &key->node;
            }
        }

        /* next key value */
        prev_key = key;
        keystr = delim;
        lysc_update_path(ctx, NULL, NULL);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* uniques */
    if (list_p->uniques) {
        LY_CHECK_RET(lys_compile_node_list_unique(ctx, list_p->uniques, list));
    }

    LY_LIST_FOR((struct lysp_node *)list_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)list_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* checks */
    if (list->min > list->max) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List min-elements %" PRIu32 " is bigger than max-elements %" PRIu32 ".",
                list->min, list->max);
        return LY_EVALID;
    }

done:
    return ret;
}